

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way<true,unsigned_char>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uchar *cache_input,uchar *cache_output,size_t n)

{
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  uchar uVar1;
  byte *pbVar2;
  byte *pbVar3;
  uchar *puVar4;
  int iVar5;
  MergeResult MVar6;
  MergeResult MVar7;
  uchar **ppuVar8;
  uchar *puVar9;
  uint uVar10;
  lcp_t lVar11;
  ptrdiff_t _Num;
  ulong uVar12;
  size_t n_00;
  uchar **ppuVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  uchar uVar18;
  
  if (n < 0x20) {
    if (1 < n) {
      uVar12 = n & 0xffffffff;
      ppuVar8 = strings_input;
      do {
        pbVar2 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar13 = ppuVar8; strings_input < ppuVar13; ppuVar13 = ppuVar13 + -1) {
          pbVar3 = ppuVar13[-1];
          bVar15 = *pbVar3;
          bVar16 = *pbVar2;
          if (bVar15 != 0 && bVar15 == bVar16) {
            lVar17 = 1;
            do {
              bVar15 = pbVar3[lVar17];
              bVar16 = pbVar2[lVar17];
              if (bVar15 == 0) break;
              lVar17 = lVar17 + 1;
            } while (bVar15 == bVar16);
          }
          if (bVar15 <= bVar16) break;
          *ppuVar13 = pbVar3;
        }
        iVar5 = (int)uVar12;
        *ppuVar13 = pbVar2;
        uVar12 = (ulong)(iVar5 - 1);
      } while (2 < iVar5);
    }
    puVar9 = strings_input[1];
    lVar11 = 0;
    uVar18 = **strings_input;
    uVar1 = uVar18;
    while ((uVar1 != '\0' && (uVar1 == puVar9[lVar11]))) {
      lVar17 = lVar11 + 1;
      lVar11 = lVar11 + 1;
      uVar1 = (*strings_input)[lVar17];
    }
    *lcp_input = lVar11;
    *cache_input = uVar18;
    if (1 < n - 1) {
      uVar12 = 1;
      uVar10 = 1;
      do {
        uVar14 = (ulong)(uVar10 + 1);
        puVar4 = strings_input[uVar14];
        lVar11 = 0;
        uVar18 = *puVar9;
        while ((uVar18 != '\0' && (uVar18 == puVar4[lVar11]))) {
          lVar17 = lVar11 + 1;
          lVar11 = lVar11 + 1;
          uVar18 = puVar9[lVar17];
        }
        lcp_input[uVar12] = lVar11;
        cache_input[uVar12] = puVar9[lcp_input[uVar10 - 1]];
        puVar9 = puVar4;
        uVar12 = uVar14;
        uVar10 = uVar10 + 1;
      } while (uVar14 < n - 1);
    }
    if (strings_input[n - 1] != (uchar *)0x0) {
      cache_input[n - 1] = strings_input[n - 1][lcp_input[n - 2]];
      check_input<unsigned_char>(strings_input,lcp_input,cache_input,n);
      return SortedInPlace;
    }
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                  ,0x26,"unsigned char get_char(unsigned char *, size_t)");
  }
  uVar12 = n >> 1;
  MVar6 = mergesort_cache_lcp_2way<true,unsigned_char>
                    (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                     uVar12);
  puVar9 = cache_input + uVar12;
  puVar4 = cache_output + uVar12;
  n_00 = n - uVar12;
  ppuVar8 = strings_input + uVar12;
  ppuVar13 = strings_output + uVar12;
  lcp_input_00 = lcp_input + uVar12;
  lcp_output_00 = lcp_output + uVar12;
  if (MVar6 == SortedInPlace) {
    check_input<unsigned_char>(strings_input,lcp_input,cache_input,uVar12);
    MVar7 = mergesort_cache_lcp_2way<true,unsigned_char>
                      (ppuVar8,ppuVar13,lcp_input_00,lcp_output_00,puVar9,puVar4,n_00);
    check_input<unsigned_char>(ppuVar8,lcp_input_00,puVar9,n_00);
    if (MVar7 == SortedInPlace) {
      merge_cache_lcp_2way<true,unsigned_char>
                (strings_input,lcp_input,cache_input,uVar12,ppuVar8,lcp_input_00,puVar9,n_00,
                 strings_output,lcp_output,cache_output);
      return SortedInTemp;
    }
    memmove(strings_output,strings_input,uVar12 * 8);
    memcpy(cache_output,cache_input,uVar12);
    memcpy(lcp_output,lcp_input,uVar12 * 8);
    MVar6 = SortedInTemp;
  }
  else {
    check_input<unsigned_char>(strings_output,lcp_output,cache_output,uVar12);
    MVar7 = mergesort_cache_lcp_2way<true,unsigned_char>
                      (ppuVar8,ppuVar13,lcp_input_00,lcp_output_00,puVar9,puVar4,n_00);
    check_input<unsigned_char>(ppuVar13,lcp_output_00,puVar4,n_00);
    if (MVar6 == MVar7) goto LAB_001d551a;
    memmove(strings_input,strings_output,uVar12 * 8);
    memcpy(cache_input,cache_output,uVar12);
    memcpy(lcp_input,lcp_output,uVar12 * 8);
    MVar7 = SortedInTemp;
  }
  if (MVar6 != MVar7) {
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned char]"
                 );
  }
LAB_001d551a:
  merge_cache_lcp_2way<true,unsigned_char>
            (strings_output,lcp_output,cache_output,uVar12,ppuVar13,lcp_output_00,puVar4,n_00,
             strings_input,lcp_input,cache_input);
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}